

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void handle_put(mg_connection *nc,char *path,http_message *hm)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  size_t local_e8;
  int64_t local_e0;
  int64_t r2;
  int64_t r1;
  mg_str *range_hdr;
  proto_data_http *dp;
  int status_code;
  int rc;
  mg_str *cl_hdr;
  cs_stat_t st;
  http_message *hm_local;
  char *path_local;
  mg_connection *nc_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)hm;
  _status_code = mg_get_http_header(hm,"Content-Length");
  iVar1 = mg_stat(path,(cs_stat_t *)&cl_hdr);
  dp._0_4_ = 0xc9;
  if (iVar1 == 0) {
    dp._0_4_ = 200;
  }
  range_hdr = (mg_str *)nc->proto_data;
  free_http_proto_data(nc);
  dp._4_4_ = create_itermediate_directories(path);
  if (dp._4_4_ == 0) {
    mg_printf(nc,"HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n",(ulong)(uint)dp);
  }
  else if (dp._4_4_ == -1) {
    send_http_error(nc,500,(char *)0x0);
  }
  else if (_status_code == (mg_str *)0x0) {
    send_http_error(nc,0x19b,(char *)0x0);
  }
  else {
    range_hdr = (mg_str *)calloc(1,0x30);
    if (range_hdr == (mg_str *)0x0) {
      send_http_error(nc,500,(char *)0x0);
    }
    else {
      pFVar2 = fopen64(path,"w+b");
      range_hdr->p = (char *)pFVar2;
      if (pFVar2 == (FILE *)0x0) {
        send_http_error(nc,500,(char *)0x0);
        free_http_proto_data(nc);
      }
      else {
        r1 = (int64_t)mg_get_http_header((http_message *)st.__glibc_reserved[2],"Content-Range");
        r2 = 0;
        local_e0 = 0;
        *(undefined4 *)&range_hdr[2].len = 2;
        iVar1 = fileno((FILE *)range_hdr->p);
        mg_set_close_on_exec(iVar1);
        sVar3 = strtoll(_status_code->p,(char **)0x0,10);
        range_hdr->len = sVar3;
        if ((r1 != 0) && (iVar1 = parse_range_header((mg_str *)r1,&r2,&local_e0), 0 < iVar1)) {
          dp._0_4_ = 0xce;
          fseeko64((FILE *)range_hdr->p,r2,0);
          if (r2 < local_e0) {
            local_e8 = (local_e0 - r2) + 1;
          }
          else {
            local_e8 = range_hdr->len - r2;
          }
          range_hdr->len = local_e8;
        }
        mg_printf(nc,"HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n",(ulong)(uint)dp);
        nc->proto_data = range_hdr;
        mbuf_remove(&nc->recv_mbuf,
                    *(long *)(st.__glibc_reserved[2] + 8) -
                    *(long *)(st.__glibc_reserved[2] + 0x570));
        transfer_file_data(nc);
      }
    }
  }
  return;
}

Assistant:

static void handle_put(struct mg_connection *nc, const char *path,
                       struct http_message *hm) {
    cs_stat_t st;
    const struct mg_str *cl_hdr = mg_get_http_header(hm, "Content-Length");
    int rc, status_code = mg_stat(path, &st) == 0 ? 200 : 201;
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;

    free_http_proto_data(nc);
    if ((rc = create_itermediate_directories(path)) == 0) {
        mg_printf(nc, "HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n", status_code);
    } else if (rc == -1) {
        send_http_error(nc, 500, NULL);
    } else if (cl_hdr == NULL) {
        send_http_error(nc, 411, NULL);
    } else if ((dp = (struct proto_data_http *) MG_CALLOC(1, sizeof(*dp))) ==
               NULL) {
        send_http_error(nc, 500, NULL); /* LCOV_EXCL_LINE */
    } else if ((dp->fp = fopen(path, "w+b")) == NULL) {
        send_http_error(nc, 500, NULL);
        free_http_proto_data(nc);
    } else {
        const struct mg_str *range_hdr = mg_get_http_header(hm, "Content-Range");
        int64_t r1 = 0, r2 = 0;
        dp->type = DATA_PUT;
        mg_set_close_on_exec(fileno(dp->fp));
        dp->cl = to64(cl_hdr->p);
        if (range_hdr != NULL && parse_range_header(range_hdr, &r1, &r2) > 0) {
            status_code = 206;
            fseeko(dp->fp, r1, SEEK_SET);
            dp->cl = r2 > r1 ? r2 - r1 + 1 : dp->cl - r1;
        }
        mg_printf(nc, "HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n", status_code);
        nc->proto_data = dp;
        /* Remove HTTP request from the mbuf, leave only payload */
        mbuf_remove(&nc->recv_mbuf, hm->message.len - hm->body.len);
        transfer_file_data(nc);
    }
}